

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

MitchellFilter *
pbrt::MitchellFilter::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  MitchellFilter *pMVar1;
  Float FVar2;
  Float B;
  Float C;
  Float local_48;
  allocator<char> local_41;
  undefined1 local_40 [36];
  Float local_1c;
  Float local_18;
  Float local_14;
  polymorphic_allocator<std::byte> local_10;
  
  local_10.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"xradius",(allocator<char> *)&local_48);
  local_18 = ParameterDictionary::GetOneFloat(parameters,(string *)local_40,2.0);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"yradius",(allocator<char> *)&local_48);
  local_1c = ParameterDictionary::GetOneFloat(parameters,(string *)local_40,2.0);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"B",(allocator<char> *)&local_14);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,(string *)local_40,0.33333334);
  std::__cxx11::string::~string((string *)local_40);
  local_48 = FVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"C",&local_41);
  FVar2 = ParameterDictionary::GetOneFloat(parameters,(string *)local_40,0.33333334);
  std::__cxx11::string::~string((string *)local_40);
  local_40._0_4_ = local_18;
  local_40._4_4_ = local_1c;
  local_14 = FVar2;
  pMVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MitchellFilter,pbrt::Vector2<float>,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&local_10,(Vector2<float> *)local_40,&local_48,&local_14,&local_10);
  return pMVar1;
}

Assistant:

MitchellFilter *MitchellFilter::Create(const ParameterDictionary &parameters,
                                       const FileLoc *loc, Allocator alloc) {
    // Find common filter parameters
    Float xw = parameters.GetOneFloat("xradius", 2.f);
    Float yw = parameters.GetOneFloat("yradius", 2.f);
    Float B = parameters.GetOneFloat("B", 1.f / 3.f);
    Float C = parameters.GetOneFloat("C", 1.f / 3.f);
    return alloc.new_object<MitchellFilter>(Vector2f(xw, yw), B, C, alloc);
}